

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   (string *__return_storage_ptr__,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *rng,string_view separator)

{
  _Base_ptr p_Var1;
  ostream *poVar2;
  ostringstream os;
  ostream oStack_1a8;
  
  if ((rng->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
    p_Var1 = (rng->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    std::operator<<(&oStack_1a8,(string *)(p_Var1 + 1));
    while( true ) {
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      if ((_Rb_tree_header *)p_Var1 == &(rng->_M_t)._M_impl.super__Rb_tree_header) break;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (&oStack_1a8,separator._M_str,separator._M_len);
      std::operator<<(poVar2,(string *)(p_Var1 + 1));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}